

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

out_of_range * nlohmann::detail::out_of_range::create(int id_,string *what_arg)

{
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string w;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int id__00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  string local_38 [44];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ename;
  
  this = in_RDI;
  ename = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"out_of_range",&local_79);
  exception::name(ename,in_ESI);
  std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  id__00 = (int)((ulong)in_RDI >> 0x20);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::c_str();
  out_of_range((out_of_range *)this,id__00,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffff50));
  std::__cxx11::string::~string(local_38);
  return (out_of_range *)this;
}

Assistant:

static out_of_range create(int id_, const std::string& what_arg)
    {
        std::string w = exception::name("out_of_range", id_) + what_arg;
        return out_of_range(id_, w.c_str());
    }